

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkMotionImposed.cpp
# Opt level: O1

void __thiscall
chrono::ChLinkMotionImposed::Update(ChLinkMotionImposed *this,double mytime,bool update_assets)

{
  ChFrame<double> *this_00;
  ChFrame<double> *pCVar1;
  int iVar2;
  ChLinkMotionImposed *pCVar3;
  MatrixBase<Eigen::Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0>_>
  *pMVar4;
  Index index;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  uint uVar8;
  long lVar9;
  ulong uVar10;
  ulong uVar11;
  long lVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  ChStarMatrix33<double> mtempM;
  ChMatrix33<double> Jw2;
  ChMatrix33<double> Jw1;
  ChMatrix33<double> Jr1;
  ChMatrix33<double> Jx2;
  ChMatrix33<double> Jx1;
  ChMatrix33<double> Jr2;
  ChFrame<double> frameMW;
  ChMatrix33<double> mtempQ;
  ChMatrix33<double> planeMW;
  ChFrame<double> frame2W;
  ChFrame<double> frame1W;
  MatrixBase<Eigen::Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0>_>
  *local_530;
  ChMatrix33<double> *local_528;
  ulong local_520;
  ulong local_510;
  double local_508;
  ulong uStack_500;
  ChLinkMotionImposed *local_4f8;
  DstXprType *local_4f0;
  undefined8 local_4e8;
  ChMatrix33<double> *local_4e0;
  double local_4d8;
  double local_4d0;
  ulong local_4c8;
  ulong uStack_4c0;
  double local_4b8;
  double local_4b0;
  ChMatrix33<double> local_4a8;
  DstXprType local_458;
  ChMatrix33<double> local_408;
  ChMatrix33<double> local_3c0;
  ChMatrix33<double> local_378;
  ChMatrix33<double> local_330;
  ChFrame<double> local_2e8;
  ChFrame<double> local_260;
  ChMatrix33<double> local_1d8;
  ChQuaternion<double> local_188;
  double dStack_168;
  double dStack_160;
  double dStack_158;
  double dStack_150;
  double local_148;
  ChFrame<double> local_140;
  ChFrame<double> local_b8;
  
  local_508 = mytime;
  ChLinkMateGeneric::Update(&this->super_ChLinkMateGeneric,mytime,update_assets);
  pCVar1 = (ChFrame<double> *)(this->super_ChLinkMateGeneric).super_ChLinkMate.super_ChLink.Body1;
  if ((pCVar1 != (ChFrame<double> *)0x0) &&
     ((this->super_ChLinkMateGeneric).super_ChLinkMate.super_ChLink.Body2 != (ChBodyFrame *)0x0)) {
    ChFrame<double>::operator>>(&local_b8,&(this->super_ChLinkMateGeneric).frame1,pCVar1);
    pCVar1 = &(this->super_ChLinkMateGeneric).frame2;
    ChFrame<double>::operator>>
              (&local_140,pCVar1,
               (ChFrame<double> *)
               (this->super_ChLinkMateGeneric).super_ChLinkMate.super_ChLink.Body2);
    this_00 = &this->frameM2;
    (*((this->rotation_function).
       super___shared_ptr<chrono::ChFunctionRotation,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
      _vptr_ChFunctionRotation[3])(local_508,&local_260);
    ChFrame<double>::SetRot(this_00,(ChQuaternion<double> *)&local_260);
    (*((this->position_function).
       super___shared_ptr<chrono::ChFunctionPosition,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
      _vptr_ChFunctionPosition[3])(&local_260);
    if ((ChFrame<double> *)&(this->frameM2).coord != &local_260) {
      (this->frameM2).coord.pos.m_data[0] = (double)local_260._vptr_ChFrame;
      (this->frameM2).coord.pos.m_data[1] = local_260.coord.pos.m_data[0];
      (this->frameM2).coord.pos.m_data[2] = local_260.coord.pos.m_data[1];
    }
    ChFrame<double>::operator>>(&local_260,this_00,pCVar1);
    ChFrame<double>::operator=(&this->frameMb2,&local_260);
    ChFrame<double>::operator>>(&local_260,this_00,&local_140);
    local_188.m_data[0] = 1.0;
    local_188.m_data[1] = 0.0;
    local_188.m_data[2] = 0.0;
    local_188.m_data[3] = 0.0;
    local_2e8._vptr_ChFrame = (_func_int **)&PTR__ChFrame_00b2b308;
    local_2e8.coord.pos.m_data[0] = 0.0;
    local_2e8.coord.pos.m_data[1] = 0.0;
    local_2e8.coord.pos.m_data[2] = 0.0;
    local_2e8.coord.rot.m_data[0] = 1.0;
    local_2e8.coord.rot.m_data[1] = 0.0;
    local_2e8.coord.rot.m_data[2] = 0.0;
    local_2e8.coord.rot.m_data[3] = 0.0;
    ChMatrix33<double>::ChMatrix33(&local_2e8.Amatrix,&local_188);
    ChFrame<double>::TransformParentToLocal(&local_260,&local_b8,&local_2e8);
    local_148 = local_260.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                [8];
    local_188.m_data[0] =
         local_260.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
    local_188.m_data[1] =
         local_260.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1];
    local_188.m_data[2] =
         local_260.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2];
    local_188.m_data[3] =
         local_260.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3];
    dStack_168 = local_260.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [4];
    dStack_160 = local_260.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [5];
    dStack_158 = local_260.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [6];
    dStack_150 = local_260.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [7];
    local_4a8.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1] =
         (double)&(((this->super_ChLinkMateGeneric).super_ChLinkMate.super_ChLink.Body1)->
                  super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix;
    local_378.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1] =
         (double)&local_4a8;
    local_4a8.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4] =
         1.48219693752374e-323;
    local_378.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] =
         (double)&local_3c0;
    local_378.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2] =
         (double)&local_408;
    local_4a8.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] =
         (double)&local_188;
    local_4a8.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2] =
         (double)&local_188;
    local_4a8.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3] =
         local_4a8.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1];
    local_3c0.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] =
         (double)&local_458;
    local_378.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3] =
         (double)&local_458;
    Eigen::internal::
    copy_using_evaluator_DefaultTraversal_CompleteUnrolling<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::internal::evaluator<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_1>_>,_Eigen::internal::assign_op<double,_double>,_0>,_0,_9>
    ::run((generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::internal::evaluator<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_1>_>,_Eigen::internal::assign_op<double,_double>,_0>
           *)&local_378);
    local_378.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2] =
         (double)&(((this->super_ChLinkMateGeneric).super_ChLinkMate.super_ChLink.Body2)->
                  super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix;
    local_378.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] =
         (double)&local_188;
    ChMatrix33<double>::
    ChMatrix33<Eigen::Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,Eigen::Transpose<Eigen::Matrix<double,3,3,1,3,3>>const>,Eigen::Matrix<double,3,3,1,3,3>,0>>
              (&local_4a8,
               (MatrixBase<Eigen::Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Transpose<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0>_>
                *)&local_378);
    local_3c0.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] =
         (double)&local_188;
    ChMatrix33<double>::ChMatrix33<Eigen::Transpose<Eigen::Matrix<double,3,3,1,3,3>>>
              (&local_378,
               (MatrixBase<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_> *)&local_3c0);
    local_408.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] =
         (double)&local_188;
    ChMatrix33<double>::
    ChMatrix33<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,Eigen::Transpose<Eigen::Matrix<double,3,3,1,3,3>>const>>
              (&local_3c0,
               (MatrixBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Transpose<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>_>
                *)&local_408);
    local_4e0 = &local_330;
    local_330.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] = 0.0;
    local_330.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3] =
         (this->super_ChLinkMateGeneric).frame1.coord.pos.m_data[2];
    auVar15._0_8_ =
         -local_330.super_Matrix<double,_3,_3,_1,_3,_3>.
          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3];
    auVar15._8_8_ = 0x8000000000000000;
    local_330.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1] =
         (double)vmovlpd_avx(auVar15);
    local_330.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2] =
         (this->super_ChLinkMateGeneric).frame1.coord.pos.m_data[1];
    auVar16._8_8_ = 0;
    auVar16._0_8_ =
         local_330.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2];
    local_330.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4] = 0.0;
    local_330.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7] =
         (this->super_ChLinkMateGeneric).frame1.coord.pos.m_data[0];
    auVar13._8_8_ = 0;
    auVar13._0_8_ =
         local_330.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7];
    auVar13 = vunpcklpd_avx(auVar13,auVar16);
    local_508 = -0.0;
    uStack_500 = 0x8000000000000000;
    local_330.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5] =
         -auVar13._0_8_;
    local_330.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6] =
         -auVar13._8_8_;
    local_330.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8] = 0.0;
    local_4f0 = &local_458;
    ChMatrix33<double>::
    ChMatrix33<Eigen::Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,Eigen::Matrix<double,3,3,1,3,3>const>,Eigen::Matrix<double,3,3,1,3,3>,0>>
              (&local_408,
               (MatrixBase<Eigen::Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0>_>
                *)&local_4f0);
    local_4f0 = (DstXprType *)0x0;
    local_4d8 = (this->frameMb2).coord.pos.m_data[2];
    auVar17._0_8_ = (ulong)local_4d8 ^ (ulong)local_508;
    auVar17._8_8_ = uStack_500;
    local_4e8 = vmovlpd_avx(auVar17);
    local_4e0 = (ChMatrix33<double> *)(this->frameMb2).coord.pos.m_data[1];
    auVar18._8_8_ = 0;
    auVar18._0_8_ = local_4e0;
    local_4d0 = 0.0;
    local_4b8 = (this->frameMb2).coord.pos.m_data[0];
    auVar14._8_8_ = 0;
    auVar14._0_8_ = local_4b8;
    auVar13 = vunpcklpd_avx(auVar14,auVar18);
    local_4c8 = auVar13._0_8_ ^ (ulong)local_508;
    uStack_4c0 = auVar13._8_8_ ^ uStack_500;
    local_4b0 = 0.0;
    local_1d8.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] =
         (double)&local_4a8;
    local_1d8.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2] =
         (double)&local_4f0;
    ChMatrix33<double>::
    ChMatrix33<Eigen::Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,Eigen::Matrix<double,3,3,1,3,3>const>,Eigen::Matrix<double,3,3,1,3,3>,0>>
              (&local_330,
               (MatrixBase<Eigen::Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0>_>
                *)&local_1d8);
    local_4b8 = local_2e8.coord.rot.m_data[1] * 0.5;
    local_4e0 = (ChMatrix33<double> *)(local_2e8.coord.rot.m_data[2] * 0.5);
    local_4d8 = local_2e8.coord.rot.m_data[3] * 0.5;
    auVar21._0_8_ = (ulong)local_4d8 ^ (ulong)local_508;
    auVar21._8_8_ = uStack_500;
    local_4e8 = vmovlpd_avx(auVar21);
    auVar19._8_8_ = 0;
    auVar19._0_8_ = local_4b8;
    auVar20._8_8_ = 0;
    auVar20._0_8_ = local_4e0;
    auVar13 = vunpcklpd_avx(auVar19,auVar20);
    local_4c8 = auVar13._0_8_ ^ (ulong)local_508;
    uStack_4c0 = auVar13._8_8_ ^ uStack_500;
    local_4f0 = (DstXprType *)(local_2e8.coord.rot.m_data[0] * 0.5);
    local_530 = (MatrixBase<Eigen::Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0>_>
                 *)&local_4f0;
    local_528 = (ChMatrix33<double> *)&local_458;
    local_4d0 = (double)local_4f0;
    local_4b0 = (double)local_4f0;
    ChMatrix33<double>::operator=
              (&local_1d8,
               (MatrixBase<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0>_>
                *)&local_530);
    local_458.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0]
         = local_1d8.super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
    local_458.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1]
         = local_1d8.super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1];
    local_458.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2]
         = local_1d8.super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2];
    local_458.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3]
         = local_1d8.super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3];
    local_458.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4]
         = local_1d8.super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4];
    local_458.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5]
         = local_1d8.super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5];
    local_458.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6]
         = local_1d8.super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6];
    local_458.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7]
         = local_1d8.super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7];
    local_458.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8]
         = local_1d8.super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8];
    local_530 = (MatrixBase<Eigen::Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0>_>
                 *)&local_4f0;
    local_528 = &local_4a8;
    ChMatrix33<double>::operator=
              (&local_1d8,
               (MatrixBase<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0>_>
                *)&local_530);
    local_4a8.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] =
         local_1d8.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
    local_4a8.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1] =
         local_1d8.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1];
    local_4a8.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2] =
         local_1d8.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2];
    local_4a8.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3] =
         local_1d8.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3];
    local_4a8.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4] =
         local_1d8.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4];
    local_4a8.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5] =
         local_1d8.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5];
    local_4a8.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6] =
         local_1d8.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6];
    local_4a8.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7] =
         local_1d8.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7];
    local_4a8.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8] =
         local_1d8.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8];
    uVar8 = 0;
    if ((this->super_ChLinkMateGeneric).c_x == true) {
      if ((this->super_ChLinkMateGeneric).C.
          super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_6,_1>_>.m_storage.m_rows < 1)
      goto LAB_005d11b2;
      (this->super_ChLinkMateGeneric).C.
      super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_6,_1>_>.m_storage.m_data.array[0] =
           local_2e8.coord.pos.m_data[0];
      if ((this->super_ChLinkMateGeneric).mask.nconstr < 1) goto LAB_005d1171;
      (**(code **)((long)((*(this->super_ChLinkMateGeneric).mask.constraints.
                            super__Vector_base<chrono::ChConstraintTwoBodies_*,_std::allocator<chrono::ChConstraintTwoBodies_*>_>
                            ._M_impl.super__Vector_impl_data._M_start)->super_ChConstraintTwo).
                         super_ChConstraint._vptr_ChConstraint + 0x88))(&local_530);
      if ((long)local_520 < 3) goto LAB_005d1193;
      uVar5 = 3;
      if ((((ulong)local_530 & 7) == 0) &&
         (uVar6 = (ulong)(-((uint)((ulong)local_530 >> 3) & 0x1fffffff) & 7), uVar6 < 3)) {
        uVar5 = uVar6;
      }
      if (uVar5 != 0) {
        uVar6 = 0;
        do {
          *(double *)(local_530 + uVar6 * 8) =
               local_378.super_Matrix<double,_3,_3,_1,_3,_3>.
               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
               [uVar6];
          uVar6 = uVar6 + 1;
        } while (uVar5 != uVar6);
      }
      if (uVar5 < 3) {
        do {
          *(double *)(local_530 + uVar5 * 8) =
               local_378.super_Matrix<double,_3,_3,_1,_3,_3>.
               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
               [uVar5];
          uVar5 = uVar5 + 1;
        } while (uVar5 != 3);
      }
      if ((this->super_ChLinkMateGeneric).mask.nconstr < 1) goto LAB_005d1171;
      (**(code **)((long)((*(this->super_ChLinkMateGeneric).mask.constraints.
                            super__Vector_base<chrono::ChConstraintTwoBodies_*,_std::allocator<chrono::ChConstraintTwoBodies_*>_>
                            ._M_impl.super__Vector_impl_data._M_start)->super_ChConstraintTwo).
                         super_ChConstraint._vptr_ChConstraint + 0x88))(&local_530);
      if ((long)local_520 < 6) goto LAB_005d1193;
      pMVar4 = local_530 + 0x18;
      uVar5 = 3;
      if ((((ulong)pMVar4 & 7) == 0) &&
         (uVar6 = (ulong)(-((uint)((ulong)pMVar4 >> 3) & 0x1fffffff) & 7), uVar6 < 3)) {
        uVar5 = uVar6;
      }
      if (uVar5 != 0) {
        uVar6 = 0;
        do {
          *(double *)(pMVar4 + uVar6 * 8) =
               local_408.super_Matrix<double,_3,_3,_1,_3,_3>.
               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
               [uVar6];
          uVar6 = uVar6 + 1;
        } while (uVar5 != uVar6);
      }
      if (uVar5 < 3) {
        do {
          *(double *)(pMVar4 + uVar5 * 8) =
               local_408.super_Matrix<double,_3,_3,_1,_3,_3>.
               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
               [uVar5];
          uVar5 = uVar5 + 1;
        } while (uVar5 != 3);
      }
      if ((this->super_ChLinkMateGeneric).mask.nconstr < 1) goto LAB_005d1171;
      (**(code **)((long)((*(this->super_ChLinkMateGeneric).mask.constraints.
                            super__Vector_base<chrono::ChConstraintTwoBodies_*,_std::allocator<chrono::ChConstraintTwoBodies_*>_>
                            ._M_impl.super__Vector_impl_data._M_start)->super_ChConstraintTwo).
                         super_ChConstraint._vptr_ChConstraint + 0x90))(&local_530);
      if ((long)local_520 < 3) goto LAB_005d1193;
      uVar5 = 3;
      if ((((ulong)local_530 & 7) == 0) &&
         (uVar6 = (ulong)(-((uint)((ulong)local_530 >> 3) & 0x1fffffff) & 7), uVar6 < 3)) {
        uVar5 = uVar6;
      }
      if (uVar5 != 0) {
        uVar6 = 0;
        do {
          *(double *)(local_530 + uVar6 * 8) =
               local_3c0.super_Matrix<double,_3,_3,_1,_3,_3>.
               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
               [uVar6];
          uVar6 = uVar6 + 1;
        } while (uVar5 != uVar6);
      }
      if (uVar5 < 3) {
        do {
          *(double *)(local_530 + uVar5 * 8) =
               local_3c0.super_Matrix<double,_3,_3,_1,_3,_3>.
               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
               [uVar5];
          uVar5 = uVar5 + 1;
        } while (uVar5 != 3);
      }
      if ((this->super_ChLinkMateGeneric).mask.nconstr < 1) goto LAB_005d1171;
      (**(code **)((long)((*(this->super_ChLinkMateGeneric).mask.constraints.
                            super__Vector_base<chrono::ChConstraintTwoBodies_*,_std::allocator<chrono::ChConstraintTwoBodies_*>_>
                            ._M_impl.super__Vector_impl_data._M_start)->super_ChConstraintTwo).
                         super_ChConstraint._vptr_ChConstraint + 0x90))(&local_530);
      if ((long)local_520 < 6) goto LAB_005d1193;
      pMVar4 = local_530 + 0x18;
      uVar5 = 3;
      if ((((ulong)pMVar4 & 7) == 0) &&
         (uVar6 = (ulong)(-((uint)((ulong)pMVar4 >> 3) & 0x1fffffff) & 7), uVar6 < 3)) {
        uVar5 = uVar6;
      }
      if (uVar5 != 0) {
        uVar6 = 0;
        do {
          *(double *)(pMVar4 + uVar6 * 8) =
               local_330.super_Matrix<double,_3,_3,_1,_3,_3>.
               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
               [uVar6];
          uVar6 = uVar6 + 1;
        } while (uVar5 != uVar6);
      }
      if (uVar5 < 3) {
        do {
          *(double *)(pMVar4 + uVar5 * 8) =
               local_330.super_Matrix<double,_3,_3,_1,_3,_3>.
               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
               [uVar5];
          uVar5 = uVar5 + 1;
        } while (uVar5 != 3);
      }
      uVar8 = 1;
    }
    if ((this->super_ChLinkMateGeneric).c_y == true) {
      uVar5 = (ulong)uVar8;
      if ((this->super_ChLinkMateGeneric).C.
          super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_6,_1>_>.m_storage.m_rows <=
          (long)uVar5) goto LAB_005d11b2;
      (this->super_ChLinkMateGeneric).C.
      super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_6,_1>_>.m_storage.m_data.array[uVar5] =
           local_2e8.coord.pos.m_data[1];
      if ((this->super_ChLinkMateGeneric).mask.nconstr <= (int)uVar8) goto LAB_005d1171;
      (**(code **)((long)((this->super_ChLinkMateGeneric).mask.constraints.
                          super__Vector_base<chrono::ChConstraintTwoBodies_*,_std::allocator<chrono::ChConstraintTwoBodies_*>_>
                          ._M_impl.super__Vector_impl_data._M_start[uVar5]->super_ChConstraintTwo).
                         super_ChConstraint._vptr_ChConstraint + 0x88))(&local_530);
      if ((long)local_520 < 3) goto LAB_005d1193;
      uVar6 = 3;
      if ((((ulong)local_530 & 7) == 0) &&
         (uVar7 = (ulong)(-((uint)((ulong)local_530 >> 3) & 0x1fffffff) & 7), uVar7 < 3)) {
        uVar6 = uVar7;
      }
      if (uVar6 != 0) {
        uVar7 = 0;
        do {
          *(double *)(local_530 + uVar7 * 8) =
               local_378.super_Matrix<double,_3,_3,_1,_3,_3>.
               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
               [uVar7 + 3];
          uVar7 = uVar7 + 1;
        } while (uVar6 != uVar7);
      }
      if (uVar6 < 3) {
        do {
          *(double *)(local_530 + uVar6 * 8) =
               local_378.super_Matrix<double,_3,_3,_1,_3,_3>.
               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
               [uVar6 + 3];
          uVar6 = uVar6 + 1;
        } while (uVar6 != 3);
      }
      if ((this->super_ChLinkMateGeneric).mask.nconstr <= (int)uVar8) goto LAB_005d1171;
      (**(code **)((long)((this->super_ChLinkMateGeneric).mask.constraints.
                          super__Vector_base<chrono::ChConstraintTwoBodies_*,_std::allocator<chrono::ChConstraintTwoBodies_*>_>
                          ._M_impl.super__Vector_impl_data._M_start[uVar5]->super_ChConstraintTwo).
                         super_ChConstraint._vptr_ChConstraint + 0x88))(&local_530);
      if ((long)local_520 < 6) goto LAB_005d1193;
      pMVar4 = local_530 + 0x18;
      uVar6 = 3;
      if ((((ulong)pMVar4 & 7) == 0) &&
         (uVar7 = (ulong)(-((uint)((ulong)pMVar4 >> 3) & 0x1fffffff) & 7), uVar7 < 3)) {
        uVar6 = uVar7;
      }
      if (uVar6 != 0) {
        uVar7 = 0;
        do {
          *(double *)(pMVar4 + uVar7 * 8) =
               local_408.super_Matrix<double,_3,_3,_1,_3,_3>.
               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
               [uVar7 + 3];
          uVar7 = uVar7 + 1;
        } while (uVar6 != uVar7);
      }
      if (uVar6 < 3) {
        do {
          *(double *)(pMVar4 + uVar6 * 8) =
               local_408.super_Matrix<double,_3,_3,_1,_3,_3>.
               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
               [uVar6 + 3];
          uVar6 = uVar6 + 1;
        } while (uVar6 != 3);
      }
      if ((this->super_ChLinkMateGeneric).mask.nconstr <= (int)uVar8) goto LAB_005d1171;
      (**(code **)((long)((this->super_ChLinkMateGeneric).mask.constraints.
                          super__Vector_base<chrono::ChConstraintTwoBodies_*,_std::allocator<chrono::ChConstraintTwoBodies_*>_>
                          ._M_impl.super__Vector_impl_data._M_start[uVar5]->super_ChConstraintTwo).
                         super_ChConstraint._vptr_ChConstraint + 0x90))(&local_530);
      if ((long)local_520 < 3) goto LAB_005d1193;
      uVar6 = 3;
      if ((((ulong)local_530 & 7) == 0) &&
         (uVar7 = (ulong)(-((uint)((ulong)local_530 >> 3) & 0x1fffffff) & 7), uVar7 < 3)) {
        uVar6 = uVar7;
      }
      if (uVar6 != 0) {
        uVar7 = 0;
        do {
          *(double *)(local_530 + uVar7 * 8) =
               local_3c0.super_Matrix<double,_3,_3,_1,_3,_3>.
               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
               [uVar7 + 3];
          uVar7 = uVar7 + 1;
        } while (uVar6 != uVar7);
      }
      if (uVar6 < 3) {
        do {
          *(double *)(local_530 + uVar6 * 8) =
               local_3c0.super_Matrix<double,_3,_3,_1,_3,_3>.
               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
               [uVar6 + 3];
          uVar6 = uVar6 + 1;
        } while (uVar6 != 3);
      }
      if ((this->super_ChLinkMateGeneric).mask.nconstr <= (int)uVar8) goto LAB_005d1171;
      (**(code **)((long)((this->super_ChLinkMateGeneric).mask.constraints.
                          super__Vector_base<chrono::ChConstraintTwoBodies_*,_std::allocator<chrono::ChConstraintTwoBodies_*>_>
                          ._M_impl.super__Vector_impl_data._M_start[uVar5]->super_ChConstraintTwo).
                         super_ChConstraint._vptr_ChConstraint + 0x90))(&local_530);
      if ((long)local_520 < 6) goto LAB_005d1193;
      pMVar4 = local_530 + 0x18;
      uVar5 = 3;
      if ((((ulong)pMVar4 & 7) == 0) &&
         (uVar6 = (ulong)(-((uint)((ulong)pMVar4 >> 3) & 0x1fffffff) & 7), uVar6 < 3)) {
        uVar5 = uVar6;
      }
      if (uVar5 != 0) {
        uVar6 = 0;
        do {
          *(double *)(pMVar4 + uVar6 * 8) =
               local_330.super_Matrix<double,_3,_3,_1,_3,_3>.
               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
               [uVar6 + 3];
          uVar6 = uVar6 + 1;
        } while (uVar5 != uVar6);
      }
      if (uVar5 < 3) {
        do {
          *(double *)(pMVar4 + uVar5 * 8) =
               local_330.super_Matrix<double,_3,_3,_1,_3,_3>.
               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
               [uVar5 + 3];
          uVar5 = uVar5 + 1;
        } while (uVar5 != 3);
      }
      uVar8 = uVar8 + 1;
    }
    if ((this->super_ChLinkMateGeneric).c_z == true) {
      uVar5 = (ulong)uVar8;
      if ((this->super_ChLinkMateGeneric).C.
          super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_6,_1>_>.m_storage.m_rows <=
          (long)uVar5) goto LAB_005d11b2;
      (this->super_ChLinkMateGeneric).C.
      super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_6,_1>_>.m_storage.m_data.array[uVar5] =
           local_2e8.coord.pos.m_data[2];
      if ((this->super_ChLinkMateGeneric).mask.nconstr <= (int)uVar8) goto LAB_005d1171;
      (**(code **)((long)((this->super_ChLinkMateGeneric).mask.constraints.
                          super__Vector_base<chrono::ChConstraintTwoBodies_*,_std::allocator<chrono::ChConstraintTwoBodies_*>_>
                          ._M_impl.super__Vector_impl_data._M_start[uVar5]->super_ChConstraintTwo).
                         super_ChConstraint._vptr_ChConstraint + 0x88))(&local_530);
      if ((long)local_520 < 3) goto LAB_005d1193;
      uVar6 = 3;
      if ((((ulong)local_530 & 7) == 0) &&
         (uVar7 = (ulong)(-((uint)((ulong)local_530 >> 3) & 0x1fffffff) & 7), uVar7 < 3)) {
        uVar6 = uVar7;
      }
      if (uVar6 != 0) {
        uVar7 = 0;
        do {
          *(double *)(local_530 + uVar7 * 8) =
               local_378.super_Matrix<double,_3,_3,_1,_3,_3>.
               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
               [uVar7 + 6];
          uVar7 = uVar7 + 1;
        } while (uVar6 != uVar7);
      }
      if (uVar6 < 3) {
        do {
          *(double *)(local_530 + uVar6 * 8) =
               local_378.super_Matrix<double,_3,_3,_1,_3,_3>.
               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
               [uVar6 + 6];
          uVar6 = uVar6 + 1;
        } while (uVar6 != 3);
      }
      if ((this->super_ChLinkMateGeneric).mask.nconstr <= (int)uVar8) goto LAB_005d1171;
      (**(code **)((long)((this->super_ChLinkMateGeneric).mask.constraints.
                          super__Vector_base<chrono::ChConstraintTwoBodies_*,_std::allocator<chrono::ChConstraintTwoBodies_*>_>
                          ._M_impl.super__Vector_impl_data._M_start[uVar5]->super_ChConstraintTwo).
                         super_ChConstraint._vptr_ChConstraint + 0x88))(&local_530);
      if ((long)local_520 < 6) goto LAB_005d1193;
      pMVar4 = local_530 + 0x18;
      uVar6 = 3;
      if ((((ulong)pMVar4 & 7) == 0) &&
         (uVar7 = (ulong)(-((uint)((ulong)pMVar4 >> 3) & 0x1fffffff) & 7), uVar7 < 3)) {
        uVar6 = uVar7;
      }
      if (uVar6 != 0) {
        uVar7 = 0;
        do {
          *(double *)(pMVar4 + uVar7 * 8) =
               local_408.super_Matrix<double,_3,_3,_1,_3,_3>.
               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
               [uVar7 + 6];
          uVar7 = uVar7 + 1;
        } while (uVar6 != uVar7);
      }
      if (uVar6 < 3) {
        do {
          *(double *)(pMVar4 + uVar6 * 8) =
               local_408.super_Matrix<double,_3,_3,_1,_3,_3>.
               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
               [uVar6 + 6];
          uVar6 = uVar6 + 1;
        } while (uVar6 != 3);
      }
      if ((this->super_ChLinkMateGeneric).mask.nconstr <= (int)uVar8) goto LAB_005d1171;
      (**(code **)((long)((this->super_ChLinkMateGeneric).mask.constraints.
                          super__Vector_base<chrono::ChConstraintTwoBodies_*,_std::allocator<chrono::ChConstraintTwoBodies_*>_>
                          ._M_impl.super__Vector_impl_data._M_start[uVar5]->super_ChConstraintTwo).
                         super_ChConstraint._vptr_ChConstraint + 0x90))(&local_530);
      if ((long)local_520 < 3) goto LAB_005d1193;
      uVar6 = 3;
      if ((((ulong)local_530 & 7) == 0) &&
         (uVar7 = (ulong)(-((uint)((ulong)local_530 >> 3) & 0x1fffffff) & 7), uVar7 < 3)) {
        uVar6 = uVar7;
      }
      if (uVar6 != 0) {
        uVar7 = 0;
        do {
          *(double *)(local_530 + uVar7 * 8) =
               local_3c0.super_Matrix<double,_3,_3,_1,_3,_3>.
               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
               [uVar7 + 6];
          uVar7 = uVar7 + 1;
        } while (uVar6 != uVar7);
      }
      if (uVar6 < 3) {
        do {
          *(double *)(local_530 + uVar6 * 8) =
               local_3c0.super_Matrix<double,_3,_3,_1,_3,_3>.
               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
               [uVar6 + 6];
          uVar6 = uVar6 + 1;
        } while (uVar6 != 3);
      }
      if ((this->super_ChLinkMateGeneric).mask.nconstr <= (int)uVar8) goto LAB_005d1171;
      (**(code **)((long)((this->super_ChLinkMateGeneric).mask.constraints.
                          super__Vector_base<chrono::ChConstraintTwoBodies_*,_std::allocator<chrono::ChConstraintTwoBodies_*>_>
                          ._M_impl.super__Vector_impl_data._M_start[uVar5]->super_ChConstraintTwo).
                         super_ChConstraint._vptr_ChConstraint + 0x90))(&local_530);
      if ((long)local_520 < 6) goto LAB_005d1193;
      pMVar4 = local_530 + 0x18;
      uVar5 = 3;
      if ((((ulong)pMVar4 & 7) == 0) &&
         (uVar6 = (ulong)(-((uint)((ulong)pMVar4 >> 3) & 0x1fffffff) & 7), uVar6 < 3)) {
        uVar5 = uVar6;
      }
      if (uVar5 != 0) {
        uVar6 = 0;
        do {
          *(double *)(pMVar4 + uVar6 * 8) =
               local_330.super_Matrix<double,_3,_3,_1,_3,_3>.
               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
               [uVar6 + 6];
          uVar6 = uVar6 + 1;
        } while (uVar5 != uVar6);
      }
      if (uVar5 < 3) {
        do {
          *(double *)(pMVar4 + uVar5 * 8) =
               local_330.super_Matrix<double,_3,_3,_1,_3,_3>.
               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
               [uVar5 + 6];
          uVar5 = uVar5 + 1;
        } while (uVar5 != 3);
      }
      uVar8 = uVar8 + 1;
    }
    local_4f8 = this;
    if ((this->super_ChLinkMateGeneric).c_rx == true) {
      uVar5 = (ulong)uVar8;
      if ((this->super_ChLinkMateGeneric).C.
          super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_6,_1>_>.m_storage.m_rows <=
          (long)uVar5) goto LAB_005d11b2;
      (this->super_ChLinkMateGeneric).C.
      super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_6,_1>_>.m_storage.m_data.array[uVar5] =
           local_2e8.coord.rot.m_data[1];
      if ((this->super_ChLinkMateGeneric).mask.nconstr <= (int)uVar8) goto LAB_005d1171;
      (**(code **)((long)((this->super_ChLinkMateGeneric).mask.constraints.
                          super__Vector_base<chrono::ChConstraintTwoBodies_*,_std::allocator<chrono::ChConstraintTwoBodies_*>_>
                          ._M_impl.super__Vector_impl_data._M_start[uVar5]->super_ChConstraintTwo).
                         super_ChConstraint._vptr_ChConstraint + 0x88))(&local_530);
      uVar6 = local_520;
      pMVar4 = local_530;
      if ((long)local_520 < 0) goto LAB_005d11d4;
      local_508 = (double)CONCAT44(local_508._4_4_,uVar8);
      uVar7 = local_520;
      if ((((ulong)local_530 & 7) == 0) &&
         (uVar7 = (ulong)(-((uint)((ulong)local_530 >> 3) & 0x1fffffff) & 7),
         (long)local_520 <= (long)uVar7)) {
        uVar7 = local_520;
      }
      uVar10 = local_520 - uVar7;
      uVar11 = uVar10 + 7;
      if (-1 < (long)uVar10) {
        uVar11 = uVar10;
      }
      local_510 = uVar5;
      if (0 < (long)uVar7) {
        memset(local_530,0,uVar7 * 8);
      }
      lVar9 = (uVar11 & 0xfffffffffffffff8) + uVar7;
      if (7 < (long)uVar10) {
        lVar12 = uVar7 + 8;
        if ((long)(uVar7 + 8) < lVar9) {
          lVar12 = lVar9;
        }
        memset(pMVar4 + uVar7 * 8,0,(~uVar7 + lVar12 & 0xfffffffffffffff8) * 8 + 0x40);
      }
      lVar12 = uVar6 - lVar9;
      if (lVar12 != 0 && lVar9 <= (long)uVar6) {
        memset(pMVar4 + uVar7 * 8 + ((long)uVar11 >> 3) * 0x40,0,lVar12 * 8);
      }
      if ((local_4f8->super_ChLinkMateGeneric).mask.nconstr <= local_508._0_4_) goto LAB_005d1171;
      (**(code **)((long)((local_4f8->super_ChLinkMateGeneric).mask.constraints.
                          super__Vector_base<chrono::ChConstraintTwoBodies_*,_std::allocator<chrono::ChConstraintTwoBodies_*>_>
                          ._M_impl.super__Vector_impl_data._M_start[local_510]->
                         super_ChConstraintTwo).super_ChConstraint._vptr_ChConstraint + 0x90))
                (&local_530);
      uVar5 = local_520;
      pMVar4 = local_530;
      if ((long)local_520 < 0) goto LAB_005d11d4;
      uVar6 = local_520;
      if ((((ulong)local_530 & 7) == 0) &&
         (uVar6 = (ulong)(-((uint)((ulong)local_530 >> 3) & 0x1fffffff) & 7),
         (long)local_520 <= (long)uVar6)) {
        uVar6 = local_520;
      }
      uVar11 = local_520 - uVar6;
      uVar7 = uVar11 + 7;
      if (-1 < (long)uVar11) {
        uVar7 = uVar11;
      }
      if (0 < (long)uVar6) {
        memset(local_530,0,uVar6 * 8);
      }
      lVar9 = (uVar7 & 0xfffffffffffffff8) + uVar6;
      if (7 < (long)uVar11) {
        lVar12 = uVar6 + 8;
        if ((long)(uVar6 + 8) < lVar9) {
          lVar12 = lVar9;
        }
        memset(pMVar4 + uVar6 * 8,0,(~uVar6 + lVar12 & 0xfffffffffffffff8) * 8 + 0x40);
      }
      lVar12 = uVar5 - lVar9;
      if (lVar12 != 0 && lVar9 <= (long)uVar5) {
        memset(pMVar4 + uVar6 * 8 + ((long)uVar7 >> 3) * 0x40,0,lVar12 * 8);
      }
      this = local_4f8;
      uVar5 = local_510;
      iVar2 = local_508._0_4_;
      if ((local_4f8->super_ChLinkMateGeneric).mask.nconstr <= local_508._0_4_) goto LAB_005d1171;
      (**(code **)((long)((local_4f8->super_ChLinkMateGeneric).mask.constraints.
                          super__Vector_base<chrono::ChConstraintTwoBodies_*,_std::allocator<chrono::ChConstraintTwoBodies_*>_>
                          ._M_impl.super__Vector_impl_data._M_start[local_510]->
                         super_ChConstraintTwo).super_ChConstraint._vptr_ChConstraint + 0x88))
                (&local_530);
      if ((long)local_520 < 6) goto LAB_005d1193;
      pMVar4 = local_530 + 0x18;
      uVar6 = 3;
      if ((((ulong)pMVar4 & 7) == 0) &&
         (uVar7 = (ulong)(-((uint)((ulong)pMVar4 >> 3) & 0x1fffffff) & 7), uVar7 < 3)) {
        uVar6 = uVar7;
      }
      if (uVar6 != 0) {
        uVar7 = 0;
        do {
          *(double *)(pMVar4 + uVar7 * 8) =
               local_458.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
               m_data.array[uVar7];
          uVar7 = uVar7 + 1;
        } while (uVar6 != uVar7);
      }
      if (uVar6 < 3) {
        do {
          *(double *)(pMVar4 + uVar6 * 8) =
               local_458.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
               m_data.array[uVar6];
          uVar6 = uVar6 + 1;
        } while (uVar6 != 3);
      }
      if ((this->super_ChLinkMateGeneric).mask.nconstr <= iVar2) goto LAB_005d1171;
      (**(code **)((long)((this->super_ChLinkMateGeneric).mask.constraints.
                          super__Vector_base<chrono::ChConstraintTwoBodies_*,_std::allocator<chrono::ChConstraintTwoBodies_*>_>
                          ._M_impl.super__Vector_impl_data._M_start[uVar5]->super_ChConstraintTwo).
                         super_ChConstraint._vptr_ChConstraint + 0x90))(&local_530);
      if ((long)local_520 < 6) goto LAB_005d1193;
      pMVar4 = local_530 + 0x18;
      uVar5 = 3;
      if ((((ulong)pMVar4 & 7) == 0) &&
         (uVar6 = (ulong)(-((uint)((ulong)pMVar4 >> 3) & 0x1fffffff) & 7), uVar6 < 3)) {
        uVar5 = uVar6;
      }
      if (uVar5 != 0) {
        uVar6 = 0;
        do {
          *(double *)(pMVar4 + uVar6 * 8) =
               local_4a8.super_Matrix<double,_3,_3,_1,_3,_3>.
               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
               [uVar6];
          uVar6 = uVar6 + 1;
        } while (uVar5 != uVar6);
      }
      if (uVar5 < 3) {
        do {
          *(double *)(pMVar4 + uVar5 * 8) =
               local_4a8.super_Matrix<double,_3,_3,_1,_3,_3>.
               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
               [uVar5];
          uVar5 = uVar5 + 1;
        } while (uVar5 != 3);
      }
      uVar8 = iVar2 + 1;
    }
    if ((this->super_ChLinkMateGeneric).c_ry == true) {
      if (((int)uVar8 < 0) ||
         (uVar5 = (ulong)uVar8,
         (this->super_ChLinkMateGeneric).C.
         super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_6,_1>_>.m_storage.m_rows <=
         (long)uVar5)) goto LAB_005d11b2;
      (this->super_ChLinkMateGeneric).C.
      super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_6,_1>_>.m_storage.m_data.array[uVar5] =
           local_2e8.coord.rot.m_data[2];
      if ((this->super_ChLinkMateGeneric).mask.nconstr <= (int)uVar8) goto LAB_005d1171;
      (**(code **)((long)((this->super_ChLinkMateGeneric).mask.constraints.
                          super__Vector_base<chrono::ChConstraintTwoBodies_*,_std::allocator<chrono::ChConstraintTwoBodies_*>_>
                          ._M_impl.super__Vector_impl_data._M_start[uVar5]->super_ChConstraintTwo).
                         super_ChConstraint._vptr_ChConstraint + 0x88))(&local_530);
      uVar6 = local_520;
      pMVar4 = local_530;
      if ((long)local_520 < 0) goto LAB_005d11d4;
      local_508 = (double)CONCAT44(local_508._4_4_,uVar8);
      uVar7 = local_520;
      if ((((ulong)local_530 & 7) == 0) &&
         (uVar7 = (ulong)(-((uint)((ulong)local_530 >> 3) & 0x1fffffff) & 7),
         (long)local_520 <= (long)uVar7)) {
        uVar7 = local_520;
      }
      uVar10 = local_520 - uVar7;
      uVar11 = uVar10 + 7;
      if (-1 < (long)uVar10) {
        uVar11 = uVar10;
      }
      local_510 = uVar5;
      if (0 < (long)uVar7) {
        memset(local_530,0,uVar7 * 8);
      }
      lVar9 = (uVar11 & 0xfffffffffffffff8) + uVar7;
      if (7 < (long)uVar10) {
        lVar12 = uVar7 + 8;
        if ((long)(uVar7 + 8) < lVar9) {
          lVar12 = lVar9;
        }
        memset(pMVar4 + uVar7 * 8,0,(~uVar7 + lVar12 & 0xfffffffffffffff8) * 8 + 0x40);
      }
      lVar12 = uVar6 - lVar9;
      if (lVar12 != 0 && lVar9 <= (long)uVar6) {
        memset(pMVar4 + uVar7 * 8 + ((long)uVar11 >> 3) * 0x40,0,lVar12 * 8);
      }
      if ((local_4f8->super_ChLinkMateGeneric).mask.nconstr <= local_508._0_4_) goto LAB_005d1171;
      (**(code **)((long)((local_4f8->super_ChLinkMateGeneric).mask.constraints.
                          super__Vector_base<chrono::ChConstraintTwoBodies_*,_std::allocator<chrono::ChConstraintTwoBodies_*>_>
                          ._M_impl.super__Vector_impl_data._M_start[local_510]->
                         super_ChConstraintTwo).super_ChConstraint._vptr_ChConstraint + 0x90))
                (&local_530);
      uVar5 = local_520;
      pMVar4 = local_530;
      if ((long)local_520 < 0) goto LAB_005d11d4;
      uVar6 = local_520;
      if ((((ulong)local_530 & 7) == 0) &&
         (uVar6 = (ulong)(-((uint)((ulong)local_530 >> 3) & 0x1fffffff) & 7),
         (long)local_520 <= (long)uVar6)) {
        uVar6 = local_520;
      }
      uVar11 = local_520 - uVar6;
      uVar7 = uVar11 + 7;
      if (-1 < (long)uVar11) {
        uVar7 = uVar11;
      }
      if (0 < (long)uVar6) {
        memset(local_530,0,uVar6 * 8);
      }
      lVar9 = (uVar7 & 0xfffffffffffffff8) + uVar6;
      if (7 < (long)uVar11) {
        lVar12 = uVar6 + 8;
        if ((long)(uVar6 + 8) < lVar9) {
          lVar12 = lVar9;
        }
        memset(pMVar4 + uVar6 * 8,0,(~uVar6 + lVar12 & 0xfffffffffffffff8) * 8 + 0x40);
      }
      lVar12 = uVar5 - lVar9;
      if (lVar12 != 0 && lVar9 <= (long)uVar5) {
        memset(pMVar4 + uVar6 * 8 + ((long)uVar7 >> 3) * 0x40,0,lVar12 * 8);
      }
      this = local_4f8;
      uVar5 = local_510;
      iVar2 = local_508._0_4_;
      if ((local_4f8->super_ChLinkMateGeneric).mask.nconstr <= local_508._0_4_) goto LAB_005d1171;
      (**(code **)((long)((local_4f8->super_ChLinkMateGeneric).mask.constraints.
                          super__Vector_base<chrono::ChConstraintTwoBodies_*,_std::allocator<chrono::ChConstraintTwoBodies_*>_>
                          ._M_impl.super__Vector_impl_data._M_start[local_510]->
                         super_ChConstraintTwo).super_ChConstraint._vptr_ChConstraint + 0x88))
                (&local_530);
      if ((long)local_520 < 6) goto LAB_005d1193;
      pMVar4 = local_530 + 0x18;
      uVar6 = 3;
      if ((((ulong)pMVar4 & 7) == 0) &&
         (uVar7 = (ulong)(-((uint)((ulong)pMVar4 >> 3) & 0x1fffffff) & 7), uVar7 < 3)) {
        uVar6 = uVar7;
      }
      if (uVar6 != 0) {
        uVar7 = 0;
        do {
          *(double *)(pMVar4 + uVar7 * 8) =
               local_458.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
               m_data.array[uVar7 + 3];
          uVar7 = uVar7 + 1;
        } while (uVar6 != uVar7);
      }
      if (uVar6 < 3) {
        do {
          *(double *)(pMVar4 + uVar6 * 8) =
               local_458.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
               m_data.array[uVar6 + 3];
          uVar6 = uVar6 + 1;
        } while (uVar6 != 3);
      }
      if ((this->super_ChLinkMateGeneric).mask.nconstr <= iVar2) goto LAB_005d1171;
      (**(code **)((long)((this->super_ChLinkMateGeneric).mask.constraints.
                          super__Vector_base<chrono::ChConstraintTwoBodies_*,_std::allocator<chrono::ChConstraintTwoBodies_*>_>
                          ._M_impl.super__Vector_impl_data._M_start[uVar5]->super_ChConstraintTwo).
                         super_ChConstraint._vptr_ChConstraint + 0x90))(&local_530);
      if ((long)local_520 < 6) goto LAB_005d1193;
      pMVar4 = local_530 + 0x18;
      uVar5 = 3;
      if ((((ulong)pMVar4 & 7) == 0) &&
         (uVar6 = (ulong)(-((uint)((ulong)pMVar4 >> 3) & 0x1fffffff) & 7), uVar6 < 3)) {
        uVar5 = uVar6;
      }
      if (uVar5 != 0) {
        uVar6 = 0;
        do {
          *(double *)(pMVar4 + uVar6 * 8) =
               local_4a8.super_Matrix<double,_3,_3,_1,_3,_3>.
               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
               [uVar6 + 3];
          uVar6 = uVar6 + 1;
        } while (uVar5 != uVar6);
      }
      if (uVar5 < 3) {
        do {
          *(double *)(pMVar4 + uVar5 * 8) =
               local_4a8.super_Matrix<double,_3,_3,_1,_3,_3>.
               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
               [uVar5 + 3];
          uVar5 = uVar5 + 1;
        } while (uVar5 != 3);
      }
      uVar8 = iVar2 + 1;
    }
    if ((this->super_ChLinkMateGeneric).c_rz == true) {
      if (((int)uVar8 < 0) ||
         (uVar5 = (ulong)uVar8,
         (this->super_ChLinkMateGeneric).C.
         super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_6,_1>_>.m_storage.m_rows <=
         (long)uVar5)) {
LAB_005d11b2:
        __assert_fail("index >= 0 && index < size()",
                      "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0x1ab,
                      "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, 1, 0, 6, 1>, 1>::operator()(Index) [Derived = Eigen::Matrix<double, -1, 1, 0, 6, 1>, Level = 1]"
                     );
      }
      (this->super_ChLinkMateGeneric).C.
      super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_6,_1>_>.m_storage.m_data.array[uVar5] =
           local_2e8.coord.rot.m_data[3];
      if ((int)uVar8 < (this->super_ChLinkMateGeneric).mask.nconstr) {
        (**(code **)((long)((this->super_ChLinkMateGeneric).mask.constraints.
                            super__Vector_base<chrono::ChConstraintTwoBodies_*,_std::allocator<chrono::ChConstraintTwoBodies_*>_>
                            ._M_impl.super__Vector_impl_data._M_start[uVar5]->super_ChConstraintTwo)
                           .super_ChConstraint._vptr_ChConstraint + 0x88))(&local_530);
        uVar6 = local_520;
        pMVar4 = local_530;
        if ((long)local_520 < 0) {
LAB_005d11d4:
          __assert_fail("rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols)"
                        ,"/usr/include/eigen3/Eigen/src/Core/CwiseNullaryOp.h",0x4a,
                        "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, Eigen::Matrix<double, 1, -1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<double>, MatrixType = Eigen::Matrix<double, 1, -1>]"
                       );
        }
        local_508 = (double)CONCAT44(local_508._4_4_,uVar8);
        uVar7 = local_520;
        if ((((ulong)local_530 & 7) == 0) &&
           (uVar7 = (ulong)(-((uint)((ulong)local_530 >> 3) & 0x1fffffff) & 7),
           (long)local_520 <= (long)uVar7)) {
          uVar7 = local_520;
        }
        uVar10 = local_520 - uVar7;
        uVar11 = uVar10 + 7;
        if (-1 < (long)uVar10) {
          uVar11 = uVar10;
        }
        local_510 = uVar5;
        if (0 < (long)uVar7) {
          memset(local_530,0,uVar7 * 8);
        }
        lVar9 = (uVar11 & 0xfffffffffffffff8) + uVar7;
        if (7 < (long)uVar10) {
          lVar12 = uVar7 + 8;
          if ((long)(uVar7 + 8) < lVar9) {
            lVar12 = lVar9;
          }
          memset(pMVar4 + uVar7 * 8,0,(~uVar7 + lVar12 & 0xfffffffffffffff8) * 8 + 0x40);
        }
        lVar12 = uVar6 - lVar9;
        if (lVar12 != 0 && lVar9 <= (long)uVar6) {
          memset(pMVar4 + uVar7 * 8 + ((long)uVar11 >> 3) * 0x40,0,lVar12 * 8);
        }
        if (local_508._0_4_ < (local_4f8->super_ChLinkMateGeneric).mask.nconstr) {
          (**(code **)((long)((local_4f8->super_ChLinkMateGeneric).mask.constraints.
                              super__Vector_base<chrono::ChConstraintTwoBodies_*,_std::allocator<chrono::ChConstraintTwoBodies_*>_>
                              ._M_impl.super__Vector_impl_data._M_start[local_510]->
                             super_ChConstraintTwo).super_ChConstraint._vptr_ChConstraint + 0x90))
                    (&local_530);
          uVar5 = local_520;
          pMVar4 = local_530;
          if ((long)local_520 < 0) goto LAB_005d11d4;
          uVar6 = local_520;
          if ((((ulong)local_530 & 7) == 0) &&
             (uVar6 = (ulong)(-((uint)((ulong)local_530 >> 3) & 0x1fffffff) & 7),
             (long)local_520 <= (long)uVar6)) {
            uVar6 = local_520;
          }
          uVar11 = local_520 - uVar6;
          uVar7 = uVar11 + 7;
          if (-1 < (long)uVar11) {
            uVar7 = uVar11;
          }
          if (0 < (long)uVar6) {
            memset(local_530,0,uVar6 * 8);
          }
          lVar9 = (uVar7 & 0xfffffffffffffff8) + uVar6;
          if (7 < (long)uVar11) {
            lVar12 = uVar6 + 8;
            if ((long)(uVar6 + 8) < lVar9) {
              lVar12 = lVar9;
            }
            memset(pMVar4 + uVar6 * 8,0,(~uVar6 + lVar12 & 0xfffffffffffffff8) * 8 + 0x40);
          }
          lVar12 = uVar5 - lVar9;
          if (lVar12 != 0 && lVar9 <= (long)uVar5) {
            memset(pMVar4 + uVar6 * 8 + ((long)uVar7 >> 3) * 0x40,0,lVar12 * 8);
          }
          pCVar3 = local_4f8;
          uVar5 = local_510;
          iVar2 = local_508._0_4_;
          if (local_508._0_4_ < (local_4f8->super_ChLinkMateGeneric).mask.nconstr) {
            (**(code **)((long)((local_4f8->super_ChLinkMateGeneric).mask.constraints.
                                super__Vector_base<chrono::ChConstraintTwoBodies_*,_std::allocator<chrono::ChConstraintTwoBodies_*>_>
                                ._M_impl.super__Vector_impl_data._M_start[local_510]->
                               super_ChConstraintTwo).super_ChConstraint._vptr_ChConstraint + 0x88))
                      (&local_530);
            if (5 < (long)local_520) {
              pMVar4 = local_530 + 0x18;
              uVar6 = 3;
              if ((((ulong)pMVar4 & 7) == 0) &&
                 (uVar7 = (ulong)(-((uint)((ulong)pMVar4 >> 3) & 0x1fffffff) & 7), uVar7 < 3)) {
                uVar6 = uVar7;
              }
              if (uVar6 != 0) {
                uVar7 = 0;
                do {
                  *(double *)(pMVar4 + uVar7 * 8) =
                       local_458.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                       m_storage.m_data.array[uVar7 + 6];
                  uVar7 = uVar7 + 1;
                } while (uVar6 != uVar7);
              }
              if (uVar6 < 3) {
                do {
                  *(double *)(pMVar4 + uVar6 * 8) =
                       local_458.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                       m_storage.m_data.array[uVar6 + 6];
                  uVar6 = uVar6 + 1;
                } while (uVar6 != 3);
              }
              if ((pCVar3->super_ChLinkMateGeneric).mask.nconstr <= iVar2) goto LAB_005d1171;
              (**(code **)((long)((pCVar3->super_ChLinkMateGeneric).mask.constraints.
                                  super__Vector_base<chrono::ChConstraintTwoBodies_*,_std::allocator<chrono::ChConstraintTwoBodies_*>_>
                                  ._M_impl.super__Vector_impl_data._M_start[uVar5]->
                                 super_ChConstraintTwo).super_ChConstraint._vptr_ChConstraint + 0x90
                          ))(&local_530);
              if (5 < (long)local_520) {
                local_530 = local_530 + 0x18;
                uVar5 = 3;
                if ((((ulong)local_530 & 7) == 0) &&
                   (uVar6 = (ulong)(-((uint)((ulong)local_530 >> 3) & 0x1fffffff) & 7), uVar6 < 3))
                {
                  uVar5 = uVar6;
                }
                if (uVar5 != 0) {
                  uVar6 = 0;
                  do {
                    *(double *)(local_530 + uVar6 * 8) =
                         local_4a8.super_Matrix<double,_3,_3,_1,_3,_3>.
                         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                         m_data.array[uVar6 + 6];
                    uVar6 = uVar6 + 1;
                  } while (uVar5 != uVar6);
                }
                if (2 < uVar5) {
                  return;
                }
                do {
                  *(double *)(local_530 + uVar5 * 8) =
                       local_4a8.super_Matrix<double,_3,_3,_1,_3,_3>.
                       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data
                       .array[uVar5 + 6];
                  uVar5 = uVar5 + 1;
                } while (uVar5 != 3);
                return;
              }
            }
LAB_005d1193:
            __assert_fail("startRow >= 0 && blockRows >= 0 && startRow <= xpr.rows() - blockRows && startCol >= 0 && blockCols >= 0 && startCol <= xpr.cols() - blockCols"
                          ,"/usr/include/eigen3/Eigen/src/Core/Block.h",0x93,
                          "Eigen::Block<Eigen::Ref<Eigen::Matrix<double, 1, -1>>, 1>::Block(XprType &, Index, Index, Index, Index) [XprType = Eigen::Ref<Eigen::Matrix<double, 1, -1>>, BlockRows = 1, BlockCols = -1, InnerPanel = false]"
                         );
          }
        }
      }
LAB_005d1171:
      __assert_fail("(i >= 0) && (i < nconstr)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/physics/ChLinkMask.h"
                    ,0x37,"ChConstraintTwoBodies &chrono::ChLinkMask::Constr_N(int)");
    }
  }
  return;
}

Assistant:

void ChLinkMotionImposed::Update(double mytime, bool update_assets) {
    // Inherit parent class:
    ChLinkMateGeneric::Update(mytime, update_assets);

    // Override the rotational jacobian [Cq] and the rotational residual C,
    // by assuming an additional hidden frame that rotates about frame2:

    if (this->Body1 && this->Body2) {
        ChFrame<> frame1W = this->frame1 >> (*this->Body1);
        ChFrame<> frame2W = this->frame2 >> (*this->Body2);

		frameM2.SetRot(rotation_function->Get_q(mytime));
		frameM2.SetPos(position_function->Get_p(mytime));
		
		frameMb2 = frameM2 >> this->frame2;

		ChFrame<> frameMW = frameM2 >> frame2W;

        ChFrame<> frame1M;
        frameMW.TransformParentToLocal(frame1W, frame1M);

        ChMatrix33<> planeMW = frameMW.GetA();

        ChMatrix33<> Jw1 = planeMW.transpose() * Body1->GetA();
        ChMatrix33<> Jw2 = -planeMW.transpose() * Body2->GetA();

		ChMatrix33<> Jx1 = planeMW.transpose();
        ChMatrix33<> Jx2 = -planeMW.transpose();

        ChMatrix33<> Jr1 = -Jw1 * ChStarMatrix33<>(frame1.GetPos());
        ChMatrix33<> Jr2 = -Jw2 * ChStarMatrix33<>(frameMb2.GetPos());

		//???? not needed, because frame1W and frameRW should always coincide when x y z translations are constrained
        //ChVector<> p2p1_base2 = Body2->GetA().transpose() * (p1_abs - p2_abs); 
        //Jr2 += frame2.GetA().transpose() * ChStarMatrix33<>(p2p1_base2);

        // Premultiply by Jw1 and Jw2 by  0.5*[Fp(q_resid)]' to get residual as imaginary part of a quaternion.
        ChStarMatrix33<> mtempM(frame1M.GetRot().GetVector() * 0.5);
        mtempM(0, 0) = 0.5 * frame1M.GetRot().e0();
        mtempM(1, 1) = 0.5 * frame1M.GetRot().e0();
        mtempM(2, 2) = 0.5 * frame1M.GetRot().e0();

        ChMatrix33<> mtempQ;
        mtempQ = mtempM.transpose() * Jw1;
        Jw1 = mtempQ;
        mtempQ = mtempM.transpose() * Jw2;
        Jw2 = mtempQ;

        int nc = 0;

        if (c_x) {
            C(nc) = frame1M.GetPos().x();
            mask.Constr_N(nc).Get_Cq_a().segment(0, 3) = Jx1.row(0);
            mask.Constr_N(nc).Get_Cq_a().segment(3, 3) = Jr1.row(0);
            mask.Constr_N(nc).Get_Cq_b().segment(0, 3) = Jx2.row(0);
            mask.Constr_N(nc).Get_Cq_b().segment(3, 3) = Jr2.row(0);
            nc++;
        }
        if (c_y) {
            C(nc) = frame1M.GetPos().y();
            mask.Constr_N(nc).Get_Cq_a().segment(0, 3) = Jx1.row(1);
            mask.Constr_N(nc).Get_Cq_a().segment(3, 3) = Jr1.row(1);
            mask.Constr_N(nc).Get_Cq_b().segment(0, 3) = Jx2.row(1);
            mask.Constr_N(nc).Get_Cq_b().segment(3, 3) = Jr2.row(1);
            nc++;
        }
        if (c_z) {
            C(nc) = frame1M.GetPos().z();
            mask.Constr_N(nc).Get_Cq_a().segment(0, 3) = Jx1.row(2);
            mask.Constr_N(nc).Get_Cq_a().segment(3, 3) = Jr1.row(2);
            mask.Constr_N(nc).Get_Cq_b().segment(0, 3) = Jx2.row(2);
            mask.Constr_N(nc).Get_Cq_b().segment(3, 3) = Jr2.row(2);
            nc++;
        }
        if (c_rx) {
            C(nc) = frame1M.GetRot().e1();
            mask.Constr_N(nc).Get_Cq_a().setZero();
            mask.Constr_N(nc).Get_Cq_b().setZero();
            mask.Constr_N(nc).Get_Cq_a().segment(3, 3) = Jw1.row(0);
            mask.Constr_N(nc).Get_Cq_b().segment(3, 3) = Jw2.row(0);
            nc++;
        }
        if (c_ry) {
            C(nc) = frame1M.GetRot().e2();
            mask.Constr_N(nc).Get_Cq_a().setZero();
            mask.Constr_N(nc).Get_Cq_b().setZero();
            mask.Constr_N(nc).Get_Cq_a().segment(3, 3) = Jw1.row(1);
            mask.Constr_N(nc).Get_Cq_b().segment(3, 3) = Jw2.row(1);
            nc++;
        }
        if (c_rz) {
            C(nc) = frame1M.GetRot().e3();
            mask.Constr_N(nc).Get_Cq_a().setZero();
            mask.Constr_N(nc).Get_Cq_b().setZero();
            mask.Constr_N(nc).Get_Cq_a().segment(3, 3) = Jw1.row(2);
            mask.Constr_N(nc).Get_Cq_b().segment(3, 3) = Jw2.row(2);
            nc++;
        }
    }
}